

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowPos(GLFWwindow *handle,int xpos,int ypos)

{
  int iVar1;
  byte *pbVar2;
  _GLFWwindow *window;
  undefined1 auStack_b0 [92];
  int iStack_54;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x48) != 0) {
    return;
  }
  XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x350),auStack_b0);
  if (iStack_54 != 2) {
    pbVar2 = (byte *)XAllocSizeHints();
    iVar1 = XGetWMNormalHints(_glfw.x11.display,*(undefined8 *)(handle + 0x350),pbVar2,auStack_b0);
    if (iVar1 != 0) {
      *pbVar2 = *pbVar2 | 4;
      pbVar2[8] = 0;
      pbVar2[9] = 0;
      pbVar2[10] = 0;
      pbVar2[0xb] = 0;
      pbVar2[0xc] = 0;
      pbVar2[0xd] = 0;
      pbVar2[0xe] = 0;
      pbVar2[0xf] = 0;
      XSetWMNormalHints(_glfw.x11.display,*(undefined8 *)(handle + 0x350),pbVar2);
    }
    XFree(pbVar2);
  }
  XMoveWindow(_glfw.x11.display,*(undefined8 *)(handle + 0x350),xpos,ypos);
  XFlush(_glfw.x11.display);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowPos(GLFWwindow* handle, int xpos, int ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformSetWindowPos(window, xpos, ypos);
}